

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::Unlock(CWallet *this,CKeyingMaterial *vMasterKeyIn)

{
  char cVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock64;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  p_Var3 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header) {
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::operator=
                (&this->vMasterKey,vMasterKeyIn);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
      boost::signals2::
      signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
      ::operator()(&this->NotifyStatusChanged,this);
      bVar2 = true;
LAB_00c28e42:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
        __stack_chk_fail();
      }
      return bVar2;
    }
    cVar1 = (**(code **)(**(long **)(p_Var3 + 2) + 0x20))(*(long **)(p_Var3 + 2),vMasterKeyIn);
    if (cVar1 == '\0') {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
      bVar2 = false;
      goto LAB_00c28e42;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
  } while( true );
}

Assistant:

bool CWallet::Unlock(const CKeyingMaterial& vMasterKeyIn)
{
    {
        LOCK(cs_wallet);
        for (const auto& spk_man_pair : m_spk_managers) {
            if (!spk_man_pair.second->CheckDecryptionKey(vMasterKeyIn)) {
                return false;
            }
        }
        vMasterKey = vMasterKeyIn;
    }
    NotifyStatusChanged(this);
    return true;
}